

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O1

int matchshreg(match *res,reg *reg,easm_expr *expr,int shl,iasctx *ctx)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  char cVar4;
  ulong uVar5;
  
  lVar2 = 0;
  while( true ) {
    while ((expr->type == EASM_EXPR_SHL && (expr->e2->type == EASM_EXPR_NUM))) {
      lVar2 = lVar2 + expr->e2->num;
      expr = expr->e1;
    }
    if (expr->type != EASM_EXPR_MUL) break;
    if (expr->e2->type == EASM_EXPR_NUM) {
      uVar5 = expr->e2->num;
      uVar3 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
      uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
      uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
      cVar4 = (char)(uVar3 >> 0x38);
      if (uVar3 >> 0x38 == 1) {
        for (; uVar5 != 1; uVar5 = uVar5 >> 1) {
          lVar2 = lVar2 + 1;
        }
        expr = expr->e1;
      }
    }
    else {
      if (expr->e1->type != EASM_EXPR_NUM) break;
      uVar5 = expr->e1->num;
      uVar3 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
      uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
      uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
      cVar4 = (char)(uVar3 >> 0x38);
      if (uVar3 >> 0x38 == 1) {
        for (; uVar5 != 1; uVar5 = uVar5 >> 1) {
          lVar2 = lVar2 + 1;
        }
        expr = expr->e2;
      }
    }
    if (cVar4 != '\x01') {
      return 0;
    }
  }
  if (lVar2 != shl) {
    return 0;
  }
  iVar1 = matchreg(res,reg,expr,ctx);
  return iVar1;
}

Assistant:

int matchshreg (struct match *res, const struct reg *reg, const struct easm_expr *expr, int shl, struct iasctx *ctx) {
	ull sh = 0;
	while (1) {
		if (expr->type == EASM_EXPR_SHL && expr->e2->type == EASM_EXPR_NUM) {
			sh += expr->e2->num;
			expr = expr->e1;
		} else if (expr->type == EASM_EXPR_MUL && expr->e2->type == EASM_EXPR_NUM) {
			ull num = expr->e2->num;
			if (!num || (num & (num-1)))
				return 0;
			while (num != 1)
				num >>= 1, sh++;
			expr = expr->e1;
		} else if (expr->type == EASM_EXPR_MUL && expr->e1->type == EASM_EXPR_NUM) {
			ull num = expr->e1->num;
			if (!num || (num & (num-1)))
				return 0;
			while (num != 1)
				num >>= 1, sh++;
			expr = expr->e2;
		} else {
			break;
		}
	}
	if (sh != shl)
		return 0;
	return matchreg(res, reg, expr, ctx);
}